

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O3

int __thiscall HTTPRequest::parse_request_line(HTTPRequest *this,char *str,ssize_t size)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  
  lVar1 = 0;
  lVar2 = lVar1;
  if (0 < size) {
    do {
      if (str[lVar1] == ' ') {
        std::__cxx11::string::_M_replace
                  ((ulong)this,0,(char *)(this->method)._M_string_length,(ulong)str);
        lVar2 = lVar1;
        break;
      }
      lVar1 = lVar1 + 1;
      lVar2 = size;
    } while (size != lVar1);
  }
  pcVar3 = str + lVar2 + 1;
  lVar1 = size - (lVar2 + 1);
  if (lVar1 == 0 || size < lVar2 + 1) {
    lVar1 = 0;
  }
  else {
    lVar2 = 0;
    do {
      if (pcVar3[lVar2] == ' ') {
        std::__cxx11::string::_M_replace
                  ((ulong)&this->uri,0,(char *)(this->uri)._M_string_length,(ulong)pcVar3);
        lVar1 = lVar2;
        break;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->version,0,(char *)(this->version)._M_string_length,
             (ulong)(pcVar3 + lVar1 + 1));
  return 0;
}

Assistant:

int HTTPRequest::parse_request_line(const char *str, ssize_t size) {
    // TODO
    ssize_t i = size;
    for (i = 0; i < size; i++) {
        if (str[i] == ' ') {
            this->method.assign(str, i * sizeof(char));
            break;
        }
    }
    i++;
    str += i;
    size -= i;
    for (i = 0; i < size; i++) {
        if (str[i] == ' ') {
            this->uri.assign(str, i * sizeof(char));
            break;
        }
    }
    i++;
    str += i;
    size -= i;
    this->version.assign(str, size * sizeof(char));
    return 0;
}